

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

Fra_Cla_t * Fra_ClassesStart(Aig_Man_t *pAig)

{
  Fra_Cla_t *pFVar1;
  Aig_Obj_t **ppAVar2;
  Vec_Ptr_t *pVVar3;
  int nCap;
  
  nCap = 1;
  pFVar1 = (Fra_Cla_t *)calloc(1,0x70);
  pFVar1->pAig = pAig;
  ppAVar2 = (Aig_Obj_t **)calloc(1,(long)pAig->vObjs->nSize << 3);
  pFVar1->pMemRepr = ppAVar2;
  pVVar3 = Vec_PtrAlloc(nCap);
  pFVar1->vClasses = pVVar3;
  pVVar3 = Vec_PtrAlloc(nCap);
  pFVar1->vClasses1 = pVVar3;
  pVVar3 = Vec_PtrAlloc(nCap);
  pFVar1->vClassesTemp = pVVar3;
  pVVar3 = Vec_PtrAlloc(nCap);
  pFVar1->vClassOld = pVVar3;
  pVVar3 = Vec_PtrAlloc(nCap);
  pFVar1->vClassNew = pVVar3;
  pFVar1->pFuncNodeHash = Fra_SmlNodeHash;
  pFVar1->pFuncNodeIsConst = Fra_SmlNodeIsConst;
  pFVar1->pFuncNodesAreEqual = Fra_SmlNodesAreEqual;
  return pFVar1;
}

Assistant:

Fra_Cla_t * Fra_ClassesStart( Aig_Man_t * pAig )
{
    Fra_Cla_t * p;
    p = ABC_ALLOC( Fra_Cla_t, 1 );
    memset( p, 0, sizeof(Fra_Cla_t) );
    p->pAig = pAig;
    p->pMemRepr  = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    memset( p->pMemRepr, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(pAig) );
    p->vClasses     = Vec_PtrAlloc( 100 );
    p->vClasses1    = Vec_PtrAlloc( 100 );
    p->vClassesTemp = Vec_PtrAlloc( 100 );
    p->vClassOld    = Vec_PtrAlloc( 100 );
    p->vClassNew    = Vec_PtrAlloc( 100 );
    p->pFuncNodeHash      = Fra_SmlNodeHash;
    p->pFuncNodeIsConst   = Fra_SmlNodeIsConst;
    p->pFuncNodesAreEqual = Fra_SmlNodesAreEqual;
    return p;
}